

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetanimator.cpp
# Opt level: O2

void __thiscall
QWidgetAnimator::animate(QWidgetAnimator *this,QWidget *widget,QRect *_final_geometry,bool animate)

{
  undefined4 uVar1;
  undefined4 uVar2;
  QWidgetData *pQVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  QRect QVar8;
  Representation RVar9;
  QWidget *pQVar10;
  uint uVar11;
  uint uVar12;
  QSize QVar13;
  QStyle *pQVar14;
  QPropertyAnimation *this_00;
  QWeakPointer<QObject> *this_01;
  int iVar15;
  long in_FS_OFFSET;
  int iVar16;
  const_iterator cVar17;
  undefined1 auVar18 [16];
  Object local_80 [8];
  QRect local_78;
  QWidget *widget_local;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = widget->data;
  uVar12 = (pQVar3->crect).x2.m_i;
  uVar11 = (pQVar3->crect).y2.m_i;
  if ((int)(uVar12 | uVar11) < 0) {
    iVar15 = 0;
    iVar16 = 0;
    uVar11 = 0xffffffff;
    uVar12 = uVar11;
  }
  else {
    iVar15 = (pQVar3->crect).x1.m_i;
    iVar16 = (pQVar3->crect).y1.m_i;
  }
  widget_local = widget;
  if ((animate) && ((uVar12 != iVar15 - 1U || (uVar11 != iVar16 - 1U)))) {
    QRect::isNull(_final_geometry);
  }
  if ((((_final_geometry->x2).m_i < (_final_geometry->x1).m_i) ||
      ((_final_geometry->y2).m_i < (_final_geometry->y1).m_i)) &&
     (pQVar3 = widget->data,
     ((pQVar3->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
      super_QFlagsStorage<Qt::WindowType>.i & 1) == 0)) {
    uVar1 = (pQVar3->crect).x1;
    uVar2 = (pQVar3->crect).y1;
    iVar15 = ((pQVar3->crect).x2.m_i ^ 0xffffffffU) + uVar1;
    iVar16 = ((pQVar3->crect).y2.m_i ^ 0xffffffffU) + uVar2;
    QVar13 = QWidget::size(widget);
    local_78.x1.m_i = iVar15 + -500;
    local_78.y1.m_i = iVar16 + -500;
    local_78.x2.m_i = QVar13.wd.m_i.m_i + iVar15 + -0x1f5;
    local_78.y2.m_i = QVar13.ht.m_i.m_i + iVar16 + -0x1f5;
  }
  else {
    uVar4 = _final_geometry->x1;
    uVar5 = _final_geometry->y1;
    uVar6 = _final_geometry->x2;
    uVar7 = _final_geometry->y2;
    local_78.x1.m_i = uVar4;
    local_78.y1.m_i = uVar5;
    local_78.x2.m_i = uVar6;
    local_78.y2.m_i = uVar7;
  }
  pQVar14 = QWidget::style(widget);
  iVar15 = (**(code **)(*(long *)pQVar14 + 0xf0))(pQVar14,0x71,0,widget,0);
  if (iVar15 == 0) {
    QWidget::setGeometry(widget,&local_78);
    QMainWindowLayout::animationFinished(*(QMainWindowLayout **)(this + 0x18),widget);
  }
  else {
    cVar17 = QHash<QWidget*,QPointer<QPropertyAnimation>>::constFindImpl<QWidget*>
                       ((QHash<QWidget*,QPointer<QPropertyAnimation>> *)(this + 0x10),&widget_local)
    ;
    if (cVar17.i.d != (Data<QHashPrivate::Node<QWidget_*,_QPointer<QPropertyAnimation>_>_> *)0x0 ||
        cVar17.i.bucket != 0) {
      QVariantAnimation::endValue();
      auVar18 = ::QVariant::toRect();
      RVar9.m_i = local_78.y2.m_i;
      if (((local_78.x1.m_i == auVar18._0_4_) && (local_78.x2.m_i == auVar18._8_4_)) &&
         (local_78.y1.m_i == auVar18._4_4_)) {
        ::QVariant::~QVariant(&local_58);
        if (RVar9.m_i == auVar18._12_4_) goto LAB_00372b7f;
      }
      else {
        ::QVariant::~QVariant(&local_58);
      }
    }
    this_00 = (QPropertyAnimation *)operator_new(0x10);
    pQVar10 = widget_local;
    QByteArray::QByteArray((QByteArray *)&local_58,"geometry",-1);
    QPropertyAnimation::QPropertyAnimation
              (this_00,&pQVar10->super_QObject,(QByteArray *)&local_58,&widget_local->super_QObject)
    ;
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
    QVariantAnimation::setDuration((DeletionPolicy)this_00);
    QEasingCurve::QEasingCurve((QEasingCurve *)&local_58,InOutQuad);
    QVariantAnimation::setEasingCurve((QEasingCurve *)this_00);
    QEasingCurve::~QEasingCurve((QEasingCurve *)&local_58);
    QVar8.y1.m_i = local_78.y1.m_i;
    QVar8.x1.m_i = local_78.x1.m_i;
    QVar8.x2.m_i = local_78.x2.m_i;
    QVar8.y2.m_i = local_78.y2.m_i;
    ::QVariant::QVariant(&local_58,QVar8);
    QVariantAnimation::setEndValue((QVariant *)this_00);
    ::QVariant::~QVariant(&local_58);
    this_01 = &QHash<QWidget_*,_QPointer<QPropertyAnimation>_>::operator[]
                         ((QHash<QWidget_*,_QPointer<QPropertyAnimation>_> *)(this + 0x10),
                          &widget_local)->wp;
    QWeakPointer<QObject>::assign<QObject>(this_01,(QObject *)this_00);
    local_58.d.data.shared = (PrivateShared *)animationFinished;
    local_58.d.data._8_8_ = 0;
    QObject::connect<void(QAbstractAnimation::*)(),void(QWidgetAnimator::*)()>
              (local_80,(offset_in_QAbstractAnimation_to_subr)this_00,
               (ContextType *)QAbstractAnimation::finished,(offset_in_QWidgetAnimator_to_subr *)0x0,
               (ConnectionType)this);
    QMetaObject::Connection::~Connection((Connection *)local_80);
    QAbstractAnimation::start((DeletionPolicy)this_00);
  }
LAB_00372b7f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetAnimator::animate(QWidget *widget, const QRect &_final_geometry, bool animate)
{
    QRect r = widget->geometry();
    if (r.right() < 0 || r.bottom() < 0)
        r = QRect();

    animate = animate && !r.isNull() && !_final_geometry.isNull();

    // might make the widget go away by sending it to negative space
    const QRect final_geometry = _final_geometry.isValid() || widget->isWindow() ? _final_geometry :
        QRect(QPoint(-500 - widget->width(), -500 - widget->height()), widget->size());

#if QT_CONFIG(animation)
    //If the QStyle has animations, animate
    if (const int animationDuration = widget->style()->styleHint(QStyle::SH_Widget_Animation_Duration, nullptr, widget)) {
        AnimationMap::const_iterator it = m_animation_map.constFind(widget);
        if (it != m_animation_map.constEnd() && (*it)->endValue().toRect() == final_geometry)
            return;

        QPropertyAnimation *anim = new QPropertyAnimation(widget, "geometry", widget);
        anim->setDuration(animate ? animationDuration : 0);
        anim->setEasingCurve(QEasingCurve::InOutQuad);
        anim->setEndValue(final_geometry);
        m_animation_map[widget] = anim;
        connect(anim, &QPropertyAnimation::finished,
                this, &QWidgetAnimator::animationFinished);
        anim->start(QPropertyAnimation::DeleteWhenStopped);
    } else
#endif // animation
    {
    //we do it in one shot
    widget->setGeometry(final_geometry);
#if QT_CONFIG(mainwindow)
    m_mainWindowLayout->animationFinished(widget);
#endif // QT_CONFIG(mainwindow)
    }
}